

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json2map.c
# Opt level: O1

int json2map_parse(json2map_t *obj,char *prefix,char *jsonString)

{
  uint num_tokens;
  int iVar1;
  size_t sVar2;
  jsmntok_t *tokens;
  jsmn_parser p;
  jsmn_parser local_3c;
  
  iVar1 = -1;
  if (jsonString != (char *)0x0) {
    jsmn_init(&local_3c);
    sVar2 = strlen(jsonString);
    num_tokens = jsmn_parse(&local_3c,jsonString,sVar2,(jsmntok_t *)0x0,0);
    if (-1 < (int)num_tokens) {
      tokens = (jsmntok_t *)malloc((ulong)num_tokens << 4);
      local_3c.pos = 0;
      sVar2 = strlen(jsonString);
      jsmn_parse(&local_3c,jsonString,sVar2,tokens,num_tokens);
      if ((num_tokens != 0) && (tokens->type == JSMN_OBJECT)) {
        iVar1 = json2map_parseObject(obj,prefix,jsonString,tokens,1,num_tokens);
        free(tokens);
      }
    }
  }
  return iVar1;
}

Assistant:

int json2map_parse(json2map_t *obj, char *prefix, char *jsonString) {
	DEBUG_TEXT("json2map_parseObject([json2map_t *], %s)... ", jsonString);

	jsmn_parser p;
	jsmntok_t *token;

	if ( jsonString == NULL ) {
		return -1;
	}

	jsmn_init(&p);

	int count = jsmn_parse(&p, jsonString, strlen(jsonString), NULL, 0);
	DEBUG_TEXT("json2map_parseObject([json2map_t *], %s): Count: %d", jsonString, count);
	if ( count < 0 ) {
		DEBUG_TEXT("json2map_parseObject([json2map_t *], %s): ERROR: no object found", jsonString);
		return -1;
	}

	token = (jsmntok_t *) malloc(sizeof(jsmntok_t) * count);
	p.pos = 0;
	jsmn_parse(&p, jsonString, strlen(jsonString), token, count);

	if ( count < 1 || token[0].type != JSMN_OBJECT ) {
		DEBUG_TEXT("json2map_parseObject([json2map_t *], %s): ERROR: first object needs to be a valid object", jsonString);
		return -1;
	}

	DEBUG_TEXT("json2map_parseObject([json2map_t *], %s)... DONE", jsonString);
	int retVal = json2map_parseObject(obj, prefix, jsonString, token, 1, count);
	free(token);
	return retVal;
}